

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ypipe.hpp
# Opt level: O2

ssize_t __thiscall
zmq::ypipe_t<zmq::command_t,_16>::read
          (ypipe_t<zmq::command_t,_16> *this,int __fd,void *__buf,size_t __nbytes)

{
  args_t *paVar1;
  endpoint_uri_pair_t **ppeVar2;
  undefined1 *puVar3;
  int iVar4;
  chunk_t *pcVar5;
  undefined8 *puVar6;
  object_t *poVar7;
  undefined8 uVar8;
  own_t *poVar9;
  own_t *poVar10;
  endpoint_uri_pair_t *peVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  bool bVar14;
  undefined7 extraout_var;
  undefined4 in_register_00000034;
  
  puVar6 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  bVar14 = check_read(this);
  if (bVar14) {
    pcVar5 = (this->_queue)._begin_chunk;
    iVar4 = (this->_queue)._begin_pos;
    poVar7 = pcVar5->values[iVar4].destination;
    uVar8 = *(undefined8 *)&pcVar5->values[iVar4].type;
    paVar1 = &pcVar5->values[iVar4].args;
    poVar9 = (paVar1->own).object;
    poVar10 = (&paVar1->own)[1].object;
    ppeVar2 = &pcVar5->values[iVar4].args.pipe_peer_stats.endpoint_pair;
    peVar11 = *ppeVar2;
    uVar12 = ppeVar2[1];
    puVar3 = &pcVar5->values[iVar4].field_0x30;
    uVar13 = *(undefined8 *)(puVar3 + 8);
    puVar6[6] = *(undefined8 *)puVar3;
    puVar6[7] = uVar13;
    puVar6[4] = peVar11;
    puVar6[5] = uVar12;
    puVar6[2] = poVar9;
    puVar6[3] = poVar10;
    *puVar6 = poVar7;
    puVar6[1] = uVar8;
    yqueue_t<zmq::command_t,_16>::pop(&this->_queue);
  }
  return CONCAT71(extraout_var,bVar14) & 0xffffffff;
}

Assistant:

bool read (T *value_)
    {
        //  Try to prefetch a value.
        if (!check_read ())
            return false;

        //  There was at least one value prefetched.
        //  Return it to the caller.
        *value_ = _queue.front ();
        _queue.pop ();
        return true;
    }